

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O2

void __thiscall
Threadpool<Workerthread>::enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
          (Threadpool<Workerthread> *this,_func_void_position_ptr_limits_ptr_bool *f,position *args,
          limits *args_1,bool *args_2)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_58;
  _Bind<void_(*(std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>))(position_&,_limits_&,_bool)>
  local_48;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_58,&this->m);
  local_48._M_f = f;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>.
  super__Tuple_impl<2UL,_std::reference_wrapper<bool>_>.
  super__Head_base<2UL,_std::reference_wrapper<bool>,_false>._M_head_impl._M_data =
       (_Head_base<2UL,_std::reference_wrapper<bool>,_false>)
       (_Head_base<2UL,_std::reference_wrapper<bool>,_false>)args_2;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>.
  super__Head_base<1UL,_std::reference_wrapper<limits>,_false>._M_head_impl._M_data =
       (reference_wrapper<limits>)(reference_wrapper<limits>)args_1;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<position>,_std::reference_wrapper<limits>,_std::reference_wrapper<bool>_>
  .super__Head_base<0UL,_std::reference_wrapper<position>,_false>._M_head_impl._M_data =
       (reference_wrapper<position>)(reference_wrapper<position>)args;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::_Bind<void(*(std::reference_wrapper<position>,std::reference_wrapper<limits>,std::reference_wrapper<bool>))(position&,limits&,bool)>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->tasks,
             &local_48);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&uStack_58);
  return;
}

Assistant:

void enqueue(TT&& f, Args&&... args) {
		std::unique_lock<std::mutex> lock(m);
		// args to bind are copied or moved (not passed by reference) .. unless wrapped in std::ref()
		tasks.emplace_back(std::bind(std::forward<TT>(f), std::ref(std::forward<Args>(args))...));
		cv_task.notify_one();
	}